

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBToUV444Row_SSSE3(uint8_t *src_argb,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  uint8_t *puVar1;
  bool bVar2;
  vec8 aiVar3;
  vec8 aiVar4;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int width_local;
  
  aiVar4 = libyuv::kARGBToU;
  aiVar3 = libyuv::kARGBToV;
  lVar6 = (long)dst_v - (long)dst_u;
  do {
    auVar7 = pmaddubsw(*(undefined1 (*) [16])src_argb,(undefined1  [16])aiVar4);
    auVar8 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x10),(undefined1  [16])aiVar4);
    auVar9 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x20),(undefined1  [16])aiVar4);
    auVar10 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x30),(undefined1  [16])aiVar4);
    auVar7 = phaddw(auVar7,auVar8);
    auVar8 = phaddw(auVar9,auVar10);
    auVar7 = psraw(auVar7,8);
    auVar8 = psraw(auVar8,8);
    auVar7 = packsswb(auVar7,auVar8);
    *dst_u = auVar7[0] + 0x80;
    dst_u[1] = auVar7[1] + 0x80;
    dst_u[2] = auVar7[2] + 0x80;
    dst_u[3] = auVar7[3] + 0x80;
    dst_u[4] = auVar7[4] + 0x80;
    dst_u[5] = auVar7[5] + 0x80;
    dst_u[6] = auVar7[6] + 0x80;
    dst_u[7] = auVar7[7] + 0x80;
    dst_u[8] = auVar7[8] + 0x80;
    dst_u[9] = auVar7[9] + 0x80;
    dst_u[10] = auVar7[10] + 0x80;
    dst_u[0xb] = auVar7[0xb] + 0x80;
    dst_u[0xc] = auVar7[0xc] + 0x80;
    dst_u[0xd] = auVar7[0xd] + 0x80;
    dst_u[0xe] = auVar7[0xe] + 0x80;
    dst_u[0xf] = auVar7[0xf] + 0x80;
    auVar7 = pmaddubsw(*(undefined1 (*) [16])src_argb,(undefined1  [16])aiVar3);
    auVar8 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x10),(undefined1  [16])aiVar3);
    auVar9 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x20),(undefined1  [16])aiVar3);
    auVar10 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x30),(undefined1  [16])aiVar3);
    auVar7 = phaddw(auVar7,auVar8);
    auVar8 = phaddw(auVar9,auVar10);
    auVar7 = psraw(auVar7,8);
    auVar8 = psraw(auVar8,8);
    auVar7 = packsswb(auVar7,auVar8);
    src_argb = (uint8_t *)((long)src_argb + 0x40);
    puVar1 = dst_u + lVar6;
    *puVar1 = auVar7[0] + 0x80;
    puVar1[1] = auVar7[1] + 0x80;
    puVar1[2] = auVar7[2] + 0x80;
    puVar1[3] = auVar7[3] + 0x80;
    puVar1[4] = auVar7[4] + 0x80;
    puVar1[5] = auVar7[5] + 0x80;
    puVar1[6] = auVar7[6] + 0x80;
    puVar1[7] = auVar7[7] + 0x80;
    puVar1[8] = auVar7[8] + 0x80;
    puVar1[9] = auVar7[9] + 0x80;
    puVar1[10] = auVar7[10] + 0x80;
    puVar1[0xb] = auVar7[0xb] + 0x80;
    puVar1[0xc] = auVar7[0xc] + 0x80;
    puVar1[0xd] = auVar7[0xd] + 0x80;
    puVar1[0xe] = auVar7[0xe] + 0x80;
    puVar1[0xf] = auVar7[0xf] + 0x80;
    dst_u = dst_u + 0x10;
    iVar5 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar2);
  return;
}

Assistant:

void ARGBToUV444Row_SSSE3(const uint8_t* src_argb,
                          uint8_t* dst_u,
                          uint8_t* dst_v,
                          int width) {
  asm volatile(
      "movdqa      %4,%%xmm3                     \n"
      "movdqa      %5,%%xmm4                     \n"
      "movdqa      %6,%%xmm5                     \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x20(%0),%%xmm2               \n"
      "movdqu      0x30(%0),%%xmm6               \n"
      "pmaddubsw   %%xmm4,%%xmm0                 \n"
      "pmaddubsw   %%xmm4,%%xmm1                 \n"
      "pmaddubsw   %%xmm4,%%xmm2                 \n"
      "pmaddubsw   %%xmm4,%%xmm6                 \n"
      "phaddw      %%xmm1,%%xmm0                 \n"
      "phaddw      %%xmm6,%%xmm2                 \n"
      "psraw       $0x8,%%xmm0                   \n"
      "psraw       $0x8,%%xmm2                   \n"
      "packsswb    %%xmm2,%%xmm0                 \n"
      "paddb       %%xmm5,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x20(%0),%%xmm2               \n"
      "movdqu      0x30(%0),%%xmm6               \n"
      "pmaddubsw   %%xmm3,%%xmm0                 \n"
      "pmaddubsw   %%xmm3,%%xmm1                 \n"
      "pmaddubsw   %%xmm3,%%xmm2                 \n"
      "pmaddubsw   %%xmm3,%%xmm6                 \n"
      "phaddw      %%xmm1,%%xmm0                 \n"
      "phaddw      %%xmm6,%%xmm2                 \n"
      "psraw       $0x8,%%xmm0                   \n"
      "psraw       $0x8,%%xmm2                   \n"
      "packsswb    %%xmm2,%%xmm0                 \n"
      "paddb       %%xmm5,%%xmm0                 \n"
      "lea         0x40(%0),%0                   \n"
      "movdqu      %%xmm0,0x00(%1,%2,1)          \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_u),     // %1
        "+r"(dst_v),     // %2
        "+rm"(width)     // %3
      : "m"(kARGBToV),   // %4
        "m"(kARGBToU),   // %5
        "m"(kAddUV128)   // %6
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm6");
}